

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  pointer ppbVar1;
  MetaLog<deflog> *this;
  basic_ostream<char,_std::char_traits<char>_> **writer;
  pointer ppbVar2;
  char *__end;
  size_t i;
  unsigned_long args;
  string local_50;
  
  this = MetaLog<deflog>::GetInstance();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/home/usr/test_log","");
  MetaLog<deflog>::Init(this,ERROR,'\x06',&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)0xf;
  local_50._M_string_length = 0x105061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_50,"A");
  local_50._M_dataplus._M_p = (pointer)0xf;
  local_50._M_string_length = 0x105061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_50,"A");
  local_50._M_dataplus._M_p = (pointer)0xf;
  local_50._M_string_length = 0x105061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_50,"A");
  local_50._M_dataplus._M_p = (pointer)0xf;
  local_50._M_string_length = 0x105061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_50,"B");
  local_50._M_dataplus._M_p = (pointer)0xf;
  local_50._M_string_length = 0x105061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_50,"A");
  args = 0;
  do {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,">>>>>>>>>>>> timed log %\n","");
    MetaLog<deflog>::TimedLog<unsigned_long>(this,ERROR,0,200,&local_50,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((int)this->max_log_level_ < 3) {
      MetaLog<deflog>::printf<unsigned_long>(this,"<<<<<<<<<<<< normal log %\n",args);
    }
    args = args + 1;
  } while (args != 50000000);
  ppbVar1 = (this->mwriter_->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar2 = (this->mwriter_->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar2 != ppbVar1;
      ppbVar2 = ppbVar2 + 1) {
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main() {
    auto& metalog_instance = MetaLog<deflog>::GetInstance();
    metalog_instance.Init(deflog::ERROR, output::out | output::logfile, "/home/usr/test_log");
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "B"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    for (size_t i = 0; i < 50000000; ++i) {
        metalog_instance.TimedLog(deflog::ERROR, 0, 200, ">>>>>>>>>>>> timed log %\n", i);
        metalog_instance.Log(deflog::ERROR, "<<<<<<<<<<<< normal log %\n", i);
    }
    metalog_instance.FlushStreams();
    return 0;
}